

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_set_loop_point_in_pcm_frames
                    (ma_data_source *pDataSource,ma_uint64 loopBegInFrames,ma_uint64 loopEndInFrames
                    )

{
  ma_data_source_base *pDataSourceBase;
  ma_uint64 loopEndInFrames_local;
  ma_uint64 loopBegInFrames_local;
  ma_data_source *pDataSource_local;
  undefined4 local_4;
  
  if (pDataSource == (ma_data_source *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (loopEndInFrames < loopBegInFrames) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((*(ulong *)((long)pDataSource + 0x10) < loopEndInFrames) &&
          (loopEndInFrames != 0xffffffffffffffff)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *(ma_uint64 *)((long)pDataSource + 0x18) = loopBegInFrames;
    *(ma_uint64 *)((long)pDataSource + 0x20) = loopEndInFrames;
    if (((ulong)(*(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8)) <
         *(ulong *)((long)pDataSource + 0x20)) && (*(long *)((long)pDataSource + 0x20) != -1)) {
      *(long *)((long)pDataSource + 0x20) =
           *(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_source_set_loop_point_in_pcm_frames(ma_data_source* pDataSource, ma_uint64 loopBegInFrames, ma_uint64 loopEndInFrames)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    if (loopEndInFrames < loopBegInFrames) {
        return MA_INVALID_ARGS; /* The end of the loop point must come after the beginning. */
    }

    if (loopEndInFrames > pDataSourceBase->rangeEndInFrames && loopEndInFrames != ~((ma_uint64)0)) {
        return MA_INVALID_ARGS; /* The end of the loop point must not go beyond the range. */
    }

    pDataSourceBase->loopBegInFrames = loopBegInFrames;
    pDataSourceBase->loopEndInFrames = loopEndInFrames;

    /* The end cannot exceed the range. */
    if (pDataSourceBase->loopEndInFrames > (pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames) && pDataSourceBase->loopEndInFrames != ~((ma_uint64)0)) {
        pDataSourceBase->loopEndInFrames = (pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames);
    }

    return MA_SUCCESS;
}